

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O3

void Q_SortEl(QMatrix *Q)

{
  ulong uVar1;
  bool bVar2;
  LASErrIdType LVar3;
  Boolean *pBVar4;
  ulong uVar5;
  
  LVar3 = LASResult();
  if ((LVar3 == LASOK) && (pBVar4 = Q->ElSorted, *pBVar4 == False)) {
    uVar1 = Q->Dim;
    if (uVar1 == 0) {
      bVar2 = true;
    }
    else {
      uVar5 = 1;
      bVar2 = true;
      do {
        qsort(Q->El[uVar5],Q->Len[uVar5],0x10,ElCompar);
        if (Q->ElOrder == Clmws) {
          if (uVar5 < Q->El[uVar5][Q->Len[uVar5] - 1].Pos) {
            bVar2 = false;
          }
        }
        else if ((Q->ElOrder == Rowws) && (Q->El[uVar5]->Pos < uVar5)) {
          bVar2 = false;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 <= uVar1);
      pBVar4 = Q->ElSorted;
    }
    *pBVar4 = True;
    *Q->DiagElAlloc = False;
    *Q->ZeroInDiag = True;
    if ((Q->Symmetry != False) && (!bVar2)) {
      LASError(LASSymStorErr,"Q_SortEl",Q->Name,(char *)0x0,(char *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void Q_SortEl(QMatrix *Q)
/* sorts elements of a row or column in ascended order */
{
    size_t Dim, RoC;
    Boolean UpperOnly;

    if (LASResult() == LASOK && !(*Q->ElSorted)) {
        Dim = Q->Dim;
        UpperOnly = True;
        for (RoC = 1; RoC <= Dim; RoC++) {
            /* sort of elements by the quick sort algorithms */
            qsort((void *)Q->El[RoC], Q->Len[RoC], sizeof(ElType), ElCompar);

            /* test whether elements contained in upper triangular part
               (incl. diagonal) of the matrix only */
            if (Q->ElOrder == Rowws) {
                if (Q->El[RoC][0].Pos < RoC)
                    UpperOnly = False;
            }
            if (Q->ElOrder == Clmws) {
                if (Q->El[RoC][Q->Len[RoC] - 1].Pos > RoC)
                    UpperOnly = False;
            }
        }
        
        *Q->ElSorted = True;
        *Q->DiagElAlloc = False;
        *Q->ZeroInDiag = True;
        
        if (Q->Symmetry) {
            if(!UpperOnly)
                LASError(LASSymStorErr, "Q_SortEl", Q->Name, NULL, NULL);
        }
    }
}